

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

Symbol * __thiscall slang::ast::ExplicitImportSymbol::importedSymbol(ExplicitImportSymbol *this)

{
  Scope *this_00;
  SyntaxNode *pSVar1;
  SourceLocation SVar2;
  PackageSymbol *this_01;
  Symbol *pSVar3;
  Diagnostic *pDVar4;
  SourceLocation errorLoc;
  undefined1 in_R9B;
  string_view packageName;
  
  if (this->initialized == false) {
    this->initialized = true;
    this_00 = (this->super_Symbol).parentScope;
    pSVar1 = (this->super_Symbol).originatingSyntax;
    if (pSVar1 == (SyntaxNode *)0x0) {
      SVar2 = (this->super_Symbol).location;
    }
    else {
      SVar2 = parsing::Token::location((Token *)(pSVar1 + 1));
    }
    errorLoc._1_7_ = 0;
    errorLoc._0_1_ = this->isFromExport;
    packageName._M_str = (char *)this_00;
    packageName._M_len = (size_t)(this->packageName)._M_str;
    this_01 = findPackage((ast *)(this->packageName)._M_len,packageName,(Scope *)SVar2,errorLoc,
                          (bool)in_R9B);
    this->package_ = this_01;
    if (this_01 == (PackageSymbol *)0x0) {
      return (Symbol *)0x0;
    }
    pSVar3 = PackageSymbol::findForImport(this_01,this->importName);
    this->import = pSVar3;
    if ((pSVar3 == (Symbol *)0x0) && ((this->importName)._M_len != 0)) {
      pSVar1 = (this->super_Symbol).originatingSyntax;
      if (pSVar1 == (SyntaxNode *)0x0) {
        SVar2 = (this->super_Symbol).location;
      }
      else {
        SVar2 = parsing::Token::location((Token *)&pSVar1[2].parent);
      }
      pDVar4 = Scope::addDiag(this_00,(DiagCode)0x3b000a,SVar2);
      pDVar4 = Diagnostic::operator<<(pDVar4,this->importName);
      Diagnostic::operator<<(pDVar4,this->packageName);
    }
  }
  return this->import;
}

Assistant:

const Symbol* ExplicitImportSymbol::importedSymbol() const {
    if (!initialized) {
        initialized = true;

        const Scope* scope = getParentScope();
        SLANG_ASSERT(scope);

        auto loc = location;
        if (auto syntax = getSyntax())
            loc = syntax->as<PackageImportItemSyntax>().package.location();

        package_ = findPackage(packageName, *scope, loc, isFromExport);
        if (!package_)
            return nullptr;

        import = package_->findForImport(importName);
        if (!import) {
            if (!importName.empty()) {
                loc = location;
                if (auto syntax = getSyntax())
                    loc = syntax->as<PackageImportItemSyntax>().item.location();

                auto& diag = scope->addDiag(diag::UnknownPackageMember, loc);
                diag << importName << packageName;
            }
        }
    }
    return import;
}